

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void use_item_common(tgestate_t *state,item_t item)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  doorindex_t *pdVar4;
  byte bVar5;
  long lVar6;
  char cVar7;
  undefined7 in_register_00000031;
  wall_t *pwVar8;
  
  if ((int)CONCAT71(in_register_00000031,item) != 0xff) {
    (state->saved_mappos).pos16.w = state->vischars[0].mi.mappos.w;
    *(undefined4 *)&state->saved_mappos = *(undefined4 *)&state->vischars[0].mi.mappos;
    if ((0xe090UL >> ((ulong)item & 0x3f) & 1) == 0) {
      switch((&use_item_common::item_actions_jump_table)[item]) {
      case (undefined *)0x106185:
        bVar5 = (state->hero_mappos).v;
        lVar6 = 0x10f1b8;
        cVar7 = -4;
        break;
      case (undefined *)0x106287:
        if ((state->room_index == '2') && (iVar3 = get_roomdef(state,'2',2), iVar3 != 0xff)) {
          set_roomdef(state,'2',2,0xff);
          set_roomdef(state,'2',0x17,0);
          setup_room(state);
          choose_game_window_attributes(state);
          plot_interior_tiles(state);
          bVar5 = 0x66;
          if (state->morale < 0x66) {
            bVar5 = state->morale;
          }
          state->morale = bVar5 + 10;
          increase_score(state,'2');
          return;
        }
        return;
      case (undefined *)0x106317:
        pdVar4 = get_nearest_door(state);
        if (pdVar4 != (doorindex_t *)0x0) {
          state->ptr_to_door_being_lockpicked = pdVar4;
          state->player_locked_out_until = state->game_counter + 0xff;
          state->vischars[0].flags = '\x01';
          queue_message(state,message_PICKING_THE_LOCK);
          return;
        }
        return;
      case (undefined *)0x106351:
        if ((0xfb < (byte)((state->hero_mappos).u + 0x93)) &&
           (0xfd < (byte)((state->hero_mappos).v + 0xb5))) {
          if (state->vischars[0].mi.sprite != sprites + 0x16) {
            solitary(state);
            return;
          }
          bVar5 = 0x66;
          if (state->morale < 0x66) {
            bVar5 = state->morale;
          }
          state->morale = bVar5 + 10;
          increase_score(state,'2');
          state->vischars[0].room = '\0';
          state->IY = state->vischars;
          transition(state,&action_papers::outside_main_gate);
          return;
        }
        return;
      }
      do {
        if ((bVar5 < *(byte *)(lVar6 + 2)) || (*(byte *)(lVar6 + 3) <= bVar5)) {
LAB_001061c3:
          lVar6 = lVar6 + 6;
          iVar3 = 0;
        }
        else {
          bVar1 = (state->hero_mappos).u;
          iVar3 = 4;
          if ((bVar1 != *(byte *)(lVar6 + 1)) &&
             (iVar3 = 5, bVar1 - 1 != (uint)*(byte *)(lVar6 + 1))) goto LAB_001061c3;
        }
        if (iVar3 != 0) {
          if (iVar3 == 1) {
            return;
          }
          if (iVar3 == 4) {
            uVar2 = '\x04';
          }
          else {
            uVar2 = '\x06';
          }
          goto LAB_0010622b;
        }
        cVar7 = cVar7 + '\x01';
      } while (cVar7 != '\0');
      bVar1 = (state->hero_mappos).u;
      pwVar8 = walls + 0x10;
      cVar7 = -3;
      do {
        if ((bVar1 < pwVar8->minx) || (pwVar8->maxx <= bVar1)) {
LAB_00106208:
          pwVar8 = pwVar8 + 1;
          iVar3 = 0;
        }
        else {
          iVar3 = 8;
          if ((bVar5 != pwVar8->miny) && (iVar3 = 9, bVar5 - 1 != (uint)pwVar8->miny))
          goto LAB_00106208;
        }
        if (iVar3 != 0) {
          if (iVar3 == 1) {
            return;
          }
          if (iVar3 == 8) {
            uVar2 = '\x05';
          }
          else {
            uVar2 = '\a';
          }
LAB_0010622b:
          state->vischars[0].direction = uVar2;
          state->vischars[0].input = 0x80;
          state->vischars[0].flags = '\x02';
          state->vischars[0].mi.mappos.w = 0xc;
          state->vischars[0].mi.sprite = sprites + 2;
          state->player_locked_out_until = state->game_counter + '`';
          queue_message(state,message_CUTTING_THE_WIRE);
          return;
        }
        cVar7 = cVar7 + '\x01';
        if (cVar7 == '\0') {
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void use_item_common(tgestate_t *state, item_t item)
{
  /**
   * $7B16: Item actions jump table.
   */
  static const item_action_t item_actions_jump_table[item__LIMIT] =
  {
    action_wiresnips,
    action_shovel,
    action_lockpick,
    action_papers,
    NULL,
    action_bribe,
    action_uniform,
    NULL,
    action_poison,
    action_red_key,
    action_yellow_key,
    action_green_key,
    action_red_cross_parcel,
    NULL,
    NULL,
    NULL,
  };

  assert(state != NULL);

  if (item == item_NONE)
    return;

  ASSERT_ITEM_VALID(item);

  memcpy(&state->saved_mappos,
         &state->vischars[0].mi.mappos,
          sizeof(mappos16_t));

  /* Conv: In the original game the action jumps to a RET for action-less
   * items. We use a NULL instead. */
  if (item_actions_jump_table[item])
    item_actions_jump_table[item](state);
}